

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTActionEvents.cpp
# Opt level: O1

void TTD::NSLogEvents::JsRTCodeParseAction_Parse
               (EventLogEntry *evt,ThreadContext *threadContext,FileReader *reader,
               UnlinkableSlabAllocator *alloc)

{
  int iVar1;
  uint32 uVar2;
  TTDVar pvVar3;
  uint64 uVar4;
  uchar *sourceBuffer;
  
  if (evt->EventKind == CodeParseActionTag) {
    (*reader->_vptr_FileReader[3])(reader,0x12,1);
    pvVar3 = NSSnapValues::ParseTTDVar(false,reader);
    *(TTDVar *)(evt + 1) = pvVar3;
    uVar4 = FileReader::ReadUInt64(reader,sourceContextId,true);
    evt[4].EventKind = (int)uVar4;
    evt[4].ResultStatus = (int)(uVar4 >> 0x20);
    (*reader->_vptr_FileReader[3])(reader,0x4f,1);
    iVar1 = (*reader->_vptr_FileReader[0x12])(reader,0);
    *(int *)&evt[4].EventTimeStamp = iVar1;
    uVar2 = FileReader::ReadUInt32(reader,bodyCounterId,true);
    *(uint32 *)&evt[1].EventTimeStamp = uVar2;
    (*reader->_vptr_FileReader[3])(reader,0x3f,1);
    (*reader->_vptr_FileReader[0x14])(reader,alloc,evt + 3,0);
    iVar1 = (*reader->_vptr_FileReader[10])(reader,10,1);
    *(char *)((long)&evt[1].EventTimeStamp + 4) = (char)iVar1;
    uVar2 = FileReader::ReadLengthValue(reader,true);
    *(uint32 *)&evt[2].EventTimeStamp = uVar2;
    sourceBuffer = SlabAllocatorBase<8>::SlabAllocateArray<unsigned_char>(alloc,(ulong)uVar2);
    *(uchar **)(evt + 2) = sourceBuffer;
    JsSupport::ReadCodeFromFile
              (threadContext,true,(uint32)evt[1].EventTimeStamp,
               *(bool *)((long)&evt[1].EventTimeStamp + 4),sourceBuffer,
               (uint32)evt[2].EventTimeStamp);
    return;
  }
  TTDAbort_unrecoverable_error("Bad tag match!");
}

Assistant:

void JsRTCodeParseAction_Parse(EventLogEntry* evt, ThreadContext* threadContext, FileReader* reader, UnlinkableSlabAllocator& alloc)
        {
            JsRTCodeParseAction* cpAction = GetInlineEventDataAs<JsRTCodeParseAction, EventKind::CodeParseActionTag>(evt);

            reader->ReadKey(NSTokens::Key::argRetVal, true);
            cpAction->Result = NSSnapValues::ParseTTDVar(false, reader);

            cpAction->SourceContextId = reader->ReadUInt64(NSTokens::Key::sourceContextId, true);
            cpAction->LoadFlag = reader->ReadTag<LoadScriptFlag>(NSTokens::Key::loadFlag, true);

            cpAction->BodyCtrId = reader->ReadUInt32(NSTokens::Key::bodyCounterId, true);

            reader->ReadString(NSTokens::Key::uri, alloc, cpAction->SourceUri, true);

            cpAction->IsUtf8 = reader->ReadBool(NSTokens::Key::boolVal, true);
            cpAction->SourceByteLength = reader->ReadLengthValue(true);

            cpAction->SourceCode = alloc.SlabAllocateArray<byte>(cpAction->SourceByteLength);

            JsSupport::ReadCodeFromFile(threadContext, true, cpAction->BodyCtrId, cpAction->IsUtf8, cpAction->SourceCode, cpAction->SourceByteLength);
        }